

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

void __thiscall
proto2_unittest::TestAllTypes::set_allocated_optional_nested_message
          (TestAllTypes *this,TestAllTypes_NestedMessage *value)

{
  TestAllTypes_NestedMessage *pTVar1;
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  uint32_t *puVar2;
  Arena *submessage_arena;
  Arena *message_arena;
  TestAllTypes_NestedMessage *value_local;
  TestAllTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  if ((message_arena_00 == (Arena *)0x0) &&
     (pTVar1 = (this->field_0)._impl_.optional_nested_message_,
     pTVar1 != (TestAllTypes_NestedMessage *)0x0)) {
    (*(pTVar1->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  message_arena = (Arena *)value;
  if (value == (TestAllTypes_NestedMessage *)0x0) {
    puVar2 = google::protobuf::internal::HasBits<2>::operator[]
                       (&(this->field_0)._impl_._has_bits_,0);
    *puVar2 = *puVar2 & 0xffffffdf;
  }
  else {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)value);
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<proto2_unittest::TestAllTypes_NestedMessage>
                              (message_arena_00,value,submessage_arena_00);
    }
    puVar2 = google::protobuf::internal::HasBits<2>::operator[]
                       (&(this->field_0)._impl_._has_bits_,0);
    *puVar2 = *puVar2 | 0x20;
  }
  (this->field_0)._impl_.optional_nested_message_ = (TestAllTypes_NestedMessage *)message_arena;
  return;
}

Assistant:

inline void TestAllTypes::set_allocated_optional_nested_message(::proto2_unittest::TestAllTypes_NestedMessage* PROTOBUF_NULLABLE value) {
  ::google::protobuf::Arena* message_arena = GetArena();
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (message_arena == nullptr) {
    delete reinterpret_cast<::google::protobuf::MessageLite*>(_impl_.optional_nested_message_);
  }

  if (value != nullptr) {
    ::google::protobuf::Arena* submessage_arena = value->GetArena();
    if (message_arena != submessage_arena) {
      value = ::google::protobuf::internal::GetOwnedMessage(message_arena, value, submessage_arena);
    }
    _impl_._has_bits_[0] |= 0x00000020u;
  } else {
    _impl_._has_bits_[0] &= ~0x00000020u;
  }

  _impl_.optional_nested_message_ = reinterpret_cast<::proto2_unittest::TestAllTypes_NestedMessage*>(value);
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.TestAllTypes.optional_nested_message)
}